

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_foreach_rest_unit_in_row
               (RestorationTileLimits *limits,int plane_w,rest_unit_visitor_t on_rest_unit,
               int row_number,int unit_size,int hnum_rest_units,int vnum_rest_units,int plane,
               void *priv,int32_t *tmpbuf,RestorationLineBuffers *rlbs,sync_read_fn_t on_sync_read,
               sync_write_fn_t on_sync_write,AV1LrSyncData *lr_sync,
               aom_internal_error_info *error_info)

{
  _Bool _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  iVar5 = 0;
  do {
    iVar3 = plane_w - iVar5;
    if (iVar3 == 0 || plane_w < iVar5) {
      return;
    }
    if ((unit_size * 3) / 2 <= iVar3) {
      iVar3 = unit_size;
    }
    limits->h_start = iVar5;
    limits->h_end = iVar3 + iVar5;
    (*on_sync_read)(lr_sync,row_number,iVar4,plane);
    if (row_number + 1 < vnum_rest_units) {
      (*on_sync_read)(lr_sync,row_number + 2,iVar4,plane);
    }
    if ((lr_sync == (AV1LrSyncData *)0x0) || (lr_sync->num_workers < 2)) {
LAB_003a60a7:
      (*on_rest_unit)(limits,hnum_rest_units * row_number + iVar4,priv,tmpbuf,rlbs,error_info);
      (*on_sync_write)(lr_sync,row_number,iVar4,hnum_rest_units,plane);
      iVar4 = iVar4 + 1;
      bVar2 = true;
      iVar5 = iVar3 + iVar5;
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)lr_sync->job_mutex);
      _Var1 = lr_sync->lr_mt_exit;
      pthread_mutex_unlock((pthread_mutex_t *)lr_sync->job_mutex);
      if (_Var1 == false) goto LAB_003a60a7;
      bVar2 = false;
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void av1_foreach_rest_unit_in_row(
    RestorationTileLimits *limits, int plane_w,
    rest_unit_visitor_t on_rest_unit, int row_number, int unit_size,
    int hnum_rest_units, int vnum_rest_units, int plane, void *priv,
    int32_t *tmpbuf, RestorationLineBuffers *rlbs, sync_read_fn_t on_sync_read,
    sync_write_fn_t on_sync_write, struct AV1LrSyncData *const lr_sync,
    struct aom_internal_error_info *error_info) {
  const int ext_size = unit_size * 3 / 2;
  int x0 = 0, j = 0;
  while (x0 < plane_w) {
    int remaining_w = plane_w - x0;
    int w = (remaining_w < ext_size) ? remaining_w : unit_size;

    limits->h_start = x0;
    limits->h_end = x0 + w;
    assert(limits->h_end <= plane_w);

    const int unit_idx = row_number * hnum_rest_units + j;

    // No sync for even numbered rows
    // For odd numbered rows, Loop Restoration of current block requires the LR
    // of top-right and bottom-right blocks to be completed

    // top-right sync
    on_sync_read(lr_sync, row_number, j, plane);
    if ((row_number + 1) < vnum_rest_units)
      // bottom-right sync
      on_sync_read(lr_sync, row_number + 2, j, plane);

#if CONFIG_MULTITHREAD
    if (lr_sync && lr_sync->num_workers > 1) {
      pthread_mutex_lock(lr_sync->job_mutex);
      const bool lr_mt_exit = lr_sync->lr_mt_exit;
      pthread_mutex_unlock(lr_sync->job_mutex);
      // Exit in case any worker has encountered an error.
      if (lr_mt_exit) return;
    }
#endif

    on_rest_unit(limits, unit_idx, priv, tmpbuf, rlbs, error_info);

    on_sync_write(lr_sync, row_number, j, hnum_rest_units, plane);

    x0 += w;
    ++j;
  }
}